

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

Integer pnga_sprs_array_duplicate(Integer s_a)

{
  long lVar1;
  Integer *pIVar2;
  Integer *pIVar3;
  Integer *pIVar4;
  Integer *pIVar5;
  Integer *pIVar6;
  _sparse_array *p_Var7;
  Integer IVar8;
  logical lVar9;
  Integer *pIVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char p_trans [2];
  Integer lo;
  Integer hi;
  Integer thi [3];
  Integer tlo [3];
  char local_a2 [2];
  Integer local_a0;
  long local_98;
  Integer local_90;
  Integer local_88;
  long local_80;
  Integer local_78;
  Integer local_70;
  Integer local_68 [4];
  Integer local_48 [3];
  
  lVar11 = s_a + 1000;
  IVar8 = SPA[s_a + 1000].grp;
  local_90 = pnga_pgroup_nodeid(IVar8);
  pnga_pgroup_nnodes(IVar8);
  lVar12 = (long)_ga_sync_begin;
  lVar13 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (lVar12 != 0) {
    pnga_pgroup_sync(IVar8);
  }
  local_88 = IVar8;
  pnga_mask_sync(lVar12,lVar13);
  IVar8 = pnga_sprs_array_create
                    (SPA[lVar11].idim,SPA[lVar11].jdim,SPA[lVar11].type,SPA[lVar11].idx_size);
  lVar1 = IVar8 + 1000;
  pnga_mask_sync(lVar12,lVar13);
  local_78 = IVar8;
  lVar9 = pnga_duplicate(SPA[lVar11].g_data,&SPA[IVar8 + 1000].g_data,"sparse_data_copy");
  if (lVar9 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_data",0);
  }
  pnga_mask_sync(lVar12,lVar13);
  lVar9 = pnga_duplicate(SPA[lVar11].g_i,&SPA[lVar1].g_i,"sparse_i_index_copy");
  if (lVar9 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_i",0);
  }
  pnga_mask_sync(lVar12,lVar13);
  lVar9 = pnga_duplicate(SPA[lVar11].g_j,&SPA[lVar1].g_j,"sparse_j_index_copy");
  if (lVar9 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_j",0);
  }
  pnga_mask_sync(lVar12,lVar13);
  lVar9 = pnga_duplicate(SPA[lVar11].g_blk,&SPA[lVar1].g_blk,"sparse_g_block_copy");
  local_80 = lVar13;
  if (lVar9 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_blk",0);
  }
  local_a2[0] = 'N';
  local_a2[1] = '\0';
  pnga_distribution(SPA[lVar1].g_i,local_90,&local_a0,&local_70);
  lVar13 = local_80;
  local_98 = lVar12;
  pnga_mask_sync(lVar12,local_80);
  pnga_copy_patch(local_a2,SPA[lVar11].g_i,&local_a0,&local_70,SPA[lVar1].g_i,&local_a0,&local_70);
  IVar8 = local_90;
  pnga_distribution(SPA[lVar1].g_j,local_90,&local_a0,&local_70);
  lVar12 = local_98;
  pnga_mask_sync(local_98,lVar13);
  pnga_copy_patch(local_a2,SPA[lVar11].g_j,&local_a0,&local_70,SPA[lVar1].g_j,&local_a0,&local_70);
  pnga_distribution(SPA[lVar1].g_data,IVar8,&local_a0,&local_70);
  pnga_mask_sync(lVar12,lVar13);
  pnga_copy_patch(local_a2,SPA[lVar11].g_data,&local_a0,&local_70,SPA[lVar1].g_data,&local_a0,
                  &local_70);
  pnga_distribution(SPA[lVar1].g_blk,IVar8,local_48,local_68);
  pnga_mask_sync(local_98,lVar13);
  pnga_copy_patch(local_a2,SPA[lVar11].g_blk,local_48,local_68,SPA[lVar1].g_blk,local_48,local_68);
  p_Var7 = SPA;
  SPA[lVar1].ihi = SPA[lVar11].ihi;
  p_Var7[lVar1].nblocks = p_Var7[lVar11].nblocks;
  IVar8 = (&p_Var7[lVar11].nval)[1];
  p_Var7[lVar1].nval = p_Var7[lVar11].nval;
  (&p_Var7[lVar1].nval)[1] = IVar8;
  p_Var7[lVar1].max_nnz = p_Var7[lVar11].max_nnz;
  p_Var7[lVar1].ready = p_Var7[lVar11].ready;
  IVar8 = (&p_Var7[lVar11].grp)[1];
  p_Var7[lVar1].grp = p_Var7[lVar11].grp;
  (&p_Var7[lVar1].grp)[1] = IVar8;
  p_Var7[lVar1].val = (void *)0x0;
  SPA[lVar1].idx = (Integer *)0x0;
  SPA[lVar1].jdx = (Integer *)0x0;
  p_Var7 = SPA;
  if (0 < SPA[lVar1].nblocks) {
    pIVar10 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var7[lVar1].blkidx = pIVar10;
    p_Var7 = SPA;
    pIVar10 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var7[lVar1].blksize = pIVar10;
    p_Var7 = SPA;
    pIVar10 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var7[lVar1].offset = pIVar10;
  }
  p_Var7 = SPA;
  if (0 < SPA[lVar1].nblocks) {
    pIVar10 = SPA[lVar11].blkidx;
    pIVar2 = SPA[lVar11].blksize;
    pIVar3 = SPA[lVar1].blkidx;
    pIVar4 = SPA[lVar1].blksize;
    pIVar5 = SPA[lVar1].offset;
    pIVar6 = SPA[lVar11].offset;
    lVar11 = 0;
    do {
      pIVar3[lVar11] = pIVar10[lVar11];
      pIVar4[lVar11] = pIVar2[lVar11];
      pIVar5[lVar11] = pIVar6[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < p_Var7[lVar1].nblocks);
  }
  if ((int)lVar13 != 0) {
    pnga_pgroup_sync(local_88);
  }
  return local_78;
}

Assistant:

Integer pnga_sprs_array_duplicate(Integer s_a)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer new_hdl;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer s_dup;
  Integer lo, hi;
  Integer i;
  char p_trans[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* create new array with same properties as old array */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  s_dup = pnga_sprs_array_create(SPA[hdl].idim,SPA[hdl].jdim,SPA[hdl].type,
      SPA[hdl].idx_size);
  /* find handle for new array and duplicate internal GAs */
  new_hdl = GA_OFFSET + s_dup;
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_data,&SPA[new_hdl].g_data,"sparse_data_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_data",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_i,&SPA[new_hdl].g_i,"sparse_i_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_i",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_j,&SPA[new_hdl].g_j,"sparse_j_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_j",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_blk,&SPA[new_hdl].g_blk,"sparse_g_block_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_blk",0);
  }

  /* Copy data from old array to new array */
  p_trans[0]='N';
  p_trans[1]='\0';
  pnga_distribution(SPA[new_hdl].g_i,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_i,&lo,&hi,SPA[new_hdl].g_i,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_j,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_j,&lo,&hi,SPA[new_hdl].g_j,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_data,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_data,&lo,&hi,SPA[new_hdl].g_data,&lo,&hi);
  {
    Integer tlo[3],thi[3];
    pnga_distribution(SPA[new_hdl].g_blk,me,tlo,thi);
    pnga_mask_sync(local_sync_begin,local_sync_end);
    pnga_copy_patch(p_trans,SPA[hdl].g_blk,tlo,thi,SPA[new_hdl].g_blk,tlo,thi);
  }
  /* copy remaining data structures */
  SPA[new_hdl].ilo = SPA[hdl].ilo;
  SPA[new_hdl].ihi = SPA[hdl].ihi;
  SPA[new_hdl].nblocks = SPA[hdl].nblocks;
  SPA[new_hdl].nval = SPA[hdl].nval;
  SPA[new_hdl].maxval = SPA[hdl].maxval;
  SPA[new_hdl].max_nnz = SPA[hdl].max_nnz;
  SPA[new_hdl].ready = SPA[hdl].ready;
  SPA[new_hdl].grp = SPA[hdl].grp;
  SPA[new_hdl].val = NULL;
  SPA[new_hdl].idx = NULL;
  SPA[new_hdl].jdx = NULL;
  if (SPA[new_hdl].nblocks > 0) {
    SPA[new_hdl].blkidx
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].blksize
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].offset
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
  }
  for (i=0; i<SPA[new_hdl].nblocks; i++) {
    SPA[new_hdl].blkidx[i] = SPA[hdl].blkidx[i];
    SPA[new_hdl].blksize[i] = SPA[hdl].blksize[i];
    SPA[new_hdl].offset[i] = SPA[hdl].offset[i];
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_dup;
}